

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O2

void __thiscall
duckdb::CSVReaderOptions::SetWriteOption(CSVReaderOptions *this,string *loption,Value *value)

{
  bool bVar1;
  BinderException *this_00;
  string *this_01;
  string format;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  bVar1 = ::std::operator==(loption,"new_line");
  if (bVar1) {
    ParseString(&format,value,loption);
    this_01 = (string *)&this->write_newline;
  }
  else {
    bVar1 = SetBaseOption(this,loption,value,true);
    if (bVar1) {
      return;
    }
    bVar1 = ::std::operator==(loption,"force_quote");
    if (bVar1) {
      ParseColumnList((vector<bool,_true> *)&format,value,&this->name_list,(string *)loption);
      ::std::vector<bool,_std::allocator<bool>_>::operator=
                (&(this->force_quote).super_vector<bool,_std::allocator<bool>_>,
                 (vector<bool,_std::allocator<bool>_> *)&format);
      ::std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                ((_Bvector_base<std::allocator<bool>_> *)&format);
      return;
    }
    bVar1 = ::std::operator==(loption,"date_format");
    if ((bVar1) || (bVar1 = ::std::operator==(loption,"dateformat"), bVar1)) {
      ParseString(&format,value,loption);
      SetDateFormat(this,DATE,&format,false);
      goto LAB_018cdda8;
    }
    bVar1 = ::std::operator==(loption,"timestamp_format");
    if ((bVar1) || (bVar1 = ::std::operator==(loption,"timestampformat"), bVar1)) {
      ParseString(&format,value,loption);
      StringUtil::Lower(&local_48,(string *)&format);
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_48,"iso");
      ::std::__cxx11::string::~string((string *)&local_48);
      if (bVar1) {
        ::std::__cxx11::string::assign((char *)&format);
      }
      SetDateFormat(this,TIMESTAMP,&format,false);
      SetDateFormat(this,TIMESTAMP_TZ,&format,false);
      goto LAB_018cdda8;
    }
    bVar1 = ::std::operator==(loption,"prefix");
    if (bVar1) {
      ParseString(&format,value,loption);
      this_01 = (string *)&this->prefix;
    }
    else {
      bVar1 = ::std::operator==(loption,"suffix");
      if (!bVar1) {
        this_00 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&format,"Unrecognized option CSV writer \"%s\"",(allocator *)&local_48)
        ;
        ::std::__cxx11::string::string((string *)&local_68,(string *)loption);
        BinderException::BinderException<std::__cxx11::string>(this_00,&format,&local_68);
        __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      ParseString(&format,value,loption);
      this_01 = (string *)&this->suffix;
    }
  }
  ::std::__cxx11::string::operator=(this_01,(string *)&format);
LAB_018cdda8:
  ::std::__cxx11::string::~string((string *)&format);
  return;
}

Assistant:

void CSVReaderOptions::SetWriteOption(const string &loption, const Value &value) {
	if (loption == "new_line") {
		// Steal this from SetBaseOption so we can write different newlines (e.g., format JSON ARRAY)
		write_newline = ParseString(value, loption);
		return;
	}

	if (SetBaseOption(loption, value, true)) {
		return;
	}

	if (loption == "force_quote") {
		force_quote = ParseColumnList(value, name_list, loption);
	} else if (loption == "date_format" || loption == "dateformat") {
		string format = ParseString(value, loption);
		SetDateFormat(LogicalTypeId::DATE, format, false);
	} else if (loption == "timestamp_format" || loption == "timestampformat") {
		string format = ParseString(value, loption);
		if (StringUtil::Lower(format) == "iso") {
			format = "%Y-%m-%dT%H:%M:%S.%fZ";
		}
		SetDateFormat(LogicalTypeId::TIMESTAMP, format, false);
		SetDateFormat(LogicalTypeId::TIMESTAMP_TZ, format, false);
	} else if (loption == "prefix") {
		prefix = ParseString(value, loption);
	} else if (loption == "suffix") {
		suffix = ParseString(value, loption);
	} else {
		throw BinderException("Unrecognized option CSV writer \"%s\"", loption);
	}
}